

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O3

void embed_prepare_cb(ev_loop *loop,ev_prepare *prepare,int revents)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  ev_loop *loop_00;
  ANFD *pAVar4;
  int iVar5;
  byte bVar6;
  WL peVar7;
  long lVar8;
  
  loop_00 = *(ev_loop **)&prepare[-2].priority;
  while( true ) {
    iVar5 = loop_00->fdchangecnt;
    if (iVar5 == 0) break;
    if (0 < iVar5) {
      lVar8 = 0;
      do {
        pAVar4 = loop_00->anfds;
        iVar3 = loop_00->fdchanges[lVar8];
        bVar1 = pAVar4[iVar3].events;
        uVar2 = pAVar4[iVar3].reify;
        bVar6 = 0;
        pAVar4[iVar3].reify = '\0';
        pAVar4[iVar3].events = '\0';
        peVar7 = pAVar4[iVar3].head;
        if (peVar7 != (WL)0x0) {
          bVar6 = 0;
          do {
            bVar6 = bVar6 | (byte)peVar7[1].pending;
            peVar7 = peVar7->next;
          } while (peVar7 != (ev_watcher_list *)0x0);
          pAVar4[iVar3].events = bVar6;
        }
        if ((bVar1 != bVar6) || ((char)uVar2 < '\0')) {
          (*loop_00->backend_modify)(loop_00,iVar3,(int)bVar1,(int)bVar6);
          iVar5 = loop_00->fdchangecnt;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar5);
    }
    loop_00->fdchangecnt = 0;
    ev_run(loop_00,1);
  }
  return;
}

Assistant:

static void
embed_prepare_cb (EV_P_ ev_prepare *prepare, int revents)
{
  ev_embed *w = (ev_embed *)(((char *)prepare) - offsetof (ev_embed, prepare));

  {
    EV_P = w->other;

    while (fdchangecnt)
      {
        fd_reify (EV_A);
        ev_run (EV_A_ EVRUN_NOWAIT);
      }
  }
}